

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::fix_in_buffer(jpeg_decoder *this)

{
  jpeg_decoder *in_RDI;
  int num_bits;
  jpeg_decoder *this_00;
  
  this_00 = in_RDI;
  if (in_RDI->m_bits_left == 0x10) {
    stuff_char(in_RDI,(uint8)in_RDI->m_bit_buf);
  }
  if (7 < in_RDI->m_bits_left) {
    stuff_char(in_RDI,(uint8)(in_RDI->m_bit_buf >> 8));
  }
  stuff_char(in_RDI,(uint8)(in_RDI->m_bit_buf >> 0x10));
  stuff_char(in_RDI,(uint8)(in_RDI->m_bit_buf >> 0x18));
  in_RDI->m_bits_left = 0x10;
  num_bits = (int)((ulong)in_RDI >> 0x20);
  get_bits_no_markers(this_00,num_bits);
  get_bits_no_markers(this_00,num_bits);
  return;
}

Assistant:

void jpeg_decoder::fix_in_buffer() {
  // In case any 0xFF's where pulled into the buffer during marker scanning.
  JPGD_ASSERT((m_bits_left & 7) == 0);

  if (m_bits_left == 16)
    stuff_char((uint8)(m_bit_buf & 0xFF));

  if (m_bits_left >= 8)
    stuff_char((uint8)((m_bit_buf >> 8) & 0xFF));

  stuff_char((uint8)((m_bit_buf >> 16) & 0xFF));
  stuff_char((uint8)((m_bit_buf >> 24) & 0xFF));

  m_bits_left = 16;
  get_bits_no_markers(16);
  get_bits_no_markers(16);
}